

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall foxxll::config::find_config(config *this)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *__s;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  long *plVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string basepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  long local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  long *local_258 [2];
  long local_248 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  int aiStack_218 [122];
  
  pcVar2 = getenv("STXXLCFG");
  if (pcVar2 != (char *)0x0) {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,pcVar2,pcVar2 + sVar3);
    std::ifstream::ifstream(&local_238,local_298._M_dataplus._M_p,_S_in);
    iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
    std::ifstream::~ifstream(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)&local_238,pcVar2,(allocator *)&local_298);
      (*this->_vptr_config[4])(this,&local_238);
      uVar8 = local_238.field_2._M_allocated_capacity;
      _Var9._M_p = local_238._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p == &local_238.field_2) {
        return;
      }
      goto LAB_00144d00;
    }
  }
  pcVar2 = getenv("HOSTNAME");
  __s = getenv("HOME");
  (*this->_vptr_config[8])(&local_238);
  puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x155fd2);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  puVar6 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6) {
    local_298.field_2._M_allocated_capacity = *puVar6;
    local_298.field_2._8_8_ = puVar4[3];
  }
  else {
    local_298.field_2._M_allocated_capacity = *puVar6;
    local_298._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_298._M_string_length = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (pcVar2 == (char *)0x0) {
LAB_0014459a:
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    std::__cxx11::string::append((char *)&local_2b8);
    std::ifstream::ifstream(&local_238,(char *)local_2b8,_S_in);
    iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
    std::ifstream::~ifstream(&local_238);
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if (iVar1 == 0) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      std::__cxx11::string::append((char *)&local_238);
      (*this->_vptr_config[4])(this,&local_238);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (__s == (char *)0x0) goto LAB_00144b60;
      local_2b8 = &local_2a8;
      sVar3 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,__s,__s + sVar3);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
      puVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_238.field_2._M_allocated_capacity = *puVar6;
        local_238.field_2._8_4_ = *(undefined4 *)(puVar4 + 3);
        local_238.field_2._12_4_ = *(undefined4 *)((long)puVar4 + 0x1c);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      }
      else {
        local_238.field_2._M_allocated_capacity = *puVar6;
        local_238._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_238._M_string_length = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      (*this->_vptr_config[8])(&local_278,this);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        uVar8 = local_238.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_270 + local_238._M_string_length) {
        uVar8 = 0xf;
        if (local_278 != &local_268) {
          uVar8 = local_268._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_270 + local_238._M_string_length) goto LAB_001447e3;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_278,0,(char *)0x0,(ulong)local_238._M_dataplus._M_p);
      }
      else {
LAB_001447e3:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_278);
      }
      puVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_298.field_2._M_allocated_capacity = *puVar6;
        local_298.field_2._8_8_ = puVar4[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar6;
        local_298._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_298._M_string_length = puVar4[1];
      *puVar4 = puVar6;
      puVar4[1] = 0;
      *(undefined1 *)puVar6 = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (pcVar2 != (char *)0x0) {
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,local_298._M_dataplus._M_p,
                   local_298._M_dataplus._M_p + local_298._M_string_length);
        std::__cxx11::string::append((char *)local_258);
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_258);
        puVar6 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar6) {
          local_268._M_allocated_capacity = *puVar6;
          local_268._8_8_ = puVar4[3];
          local_278 = &local_268;
        }
        else {
          local_268._M_allocated_capacity = *puVar6;
          local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar4;
        }
        local_270 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_2a8 = *plVar7;
          lStack_2a0 = plVar5[3];
          local_2b8 = &local_2a8;
        }
        else {
          local_2a8 = *plVar7;
          local_2b8 = (long *)*plVar5;
        }
        local_2b0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::ifstream::ifstream(&local_238,(char *)local_2b8,_S_in);
        iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
        std::ifstream::~ifstream(&local_238);
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,local_2a8 + 1);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278,local_268._M_allocated_capacity + 1);
        }
        if (local_258[0] != local_248) {
          operator_delete(local_258[0],local_248[0] + 1);
        }
        if (iVar1 == 0) {
          local_278 = &local_268;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_298._M_dataplus._M_p,
                     local_298._M_dataplus._M_p + local_298._M_string_length);
          std::__cxx11::string::append((char *)&local_278);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_2a8 = *plVar7;
            lStack_2a0 = plVar5[3];
            local_2b8 = &local_2a8;
          }
          else {
            local_2a8 = *plVar7;
            local_2b8 = (long *)*plVar5;
          }
          local_2b0 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          puVar6 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar6) {
            local_238.field_2._M_allocated_capacity = *puVar6;
            local_238.field_2._8_4_ = *(undefined4 *)(puVar4 + 3);
            local_238.field_2._12_4_ = *(undefined4 *)((long)puVar4 + 0x1c);
          }
          else {
            local_238.field_2._M_allocated_capacity = *puVar6;
            local_238._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_238._M_string_length = puVar4[1];
          *puVar4 = puVar6;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          (*this->_vptr_config[4])(this);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_2b8 != &local_2a8) {
            operator_delete(local_2b8,local_2a8 + 1);
          }
          uVar8 = local_268._M_allocated_capacity;
          _Var9._M_p = (pointer)local_278;
          if (local_278 != &local_268) goto LAB_00144ce9;
          goto LAB_00144cf1;
        }
      }
      local_2b8 = &local_2a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      std::__cxx11::string::append((char *)&local_2b8);
      std::ifstream::ifstream(&local_238,(char *)local_2b8,_S_in);
      iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
      std::ifstream::~ifstream(&local_238);
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (iVar1 != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
LAB_00144b60:
        (*this->_vptr_config[5])(this);
        return;
      }
      std::operator+(&local_238,&local_298,"");
      (*this->_vptr_config[4])(this,&local_238);
    }
    uVar8 = local_238.field_2._M_allocated_capacity;
    _Var9._M_p = local_238._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
LAB_00144ce9:
      operator_delete(_Var9._M_p,uVar8 + 1);
    }
  }
  else {
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_258,local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    std::__cxx11::string::append((char *)local_258);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)local_258);
    local_278 = &local_268;
    puVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_268._M_allocated_capacity = *puVar6;
      local_268._8_8_ = puVar4[3];
    }
    else {
      local_268._M_allocated_capacity = *puVar6;
      local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4;
    }
    local_270 = puVar4[1];
    *puVar4 = puVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_2a8 = *plVar7;
      lStack_2a0 = plVar5[3];
      local_2b8 = &local_2a8;
    }
    else {
      local_2a8 = *plVar7;
      local_2b8 = (long *)*plVar5;
    }
    local_2b0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::ifstream::ifstream(&local_238,(char *)local_2b8,_S_in);
    iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18));
    std::ifstream::~ifstream(&local_238);
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268._M_allocated_capacity + 1);
    }
    if (local_258[0] != local_248) {
      operator_delete(local_258[0],local_248[0] + 1);
    }
    if (iVar1 != 0) goto LAB_0014459a;
    local_278 = &local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_298._M_dataplus._M_p,
               local_298._M_dataplus._M_p + local_298._M_string_length);
    std::__cxx11::string::append((char *)&local_278);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_2a8 = *plVar7;
      lStack_2a0 = plVar5[3];
      local_2b8 = &local_2a8;
    }
    else {
      local_2a8 = *plVar7;
      local_2b8 = (long *)*plVar5;
    }
    local_2b0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    puVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_238.field_2._M_allocated_capacity = *puVar6;
      local_238.field_2._8_4_ = *(undefined4 *)(puVar4 + 3);
      local_238.field_2._12_4_ = *(undefined4 *)((long)puVar4 + 0x1c);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *puVar6;
      local_238._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_238._M_string_length = puVar4[1];
    *puVar4 = puVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    (*this->_vptr_config[4])(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    uVar8 = local_268._M_allocated_capacity;
    _Var9._M_p = (pointer)local_278;
    if (local_278 != &local_268) goto LAB_00144ce9;
  }
LAB_00144cf1:
  uVar8 = local_298.field_2._M_allocated_capacity;
  _Var9._M_p = local_298._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p == &local_298.field_2) {
    return;
  }
LAB_00144d00:
  operator_delete(_Var9._M_p,uVar8 + 1);
  return;
}

Assistant:

void config::find_config()
{
    // check several locations for disk configuration files

    // check STXXLCFG environment path
    const char* cfg = getenv("STXXLCFG");
    if (cfg && exist_file(cfg))
        return load_config_file(cfg);

#if !FOXXLL_WINDOWS
    // read environment, unix style
    const char* hostname = getenv("HOSTNAME");
    const char* home = getenv("HOME");
    const char* suffix = "";
#else
    // read environment, windows style
    const char* hostname = getenv("COMPUTERNAME");
    const char* home = getenv("APPDATA");
    const char* suffix = ".txt";
#endif

    // check current directory
    {
        std::string basepath = "./" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // check home directory
    if (home)
    {
        std::string basepath =
            std::string(home) + "/" + default_config_file_name();

        if (hostname && exist_file(basepath + "." + hostname + suffix))
            return load_config_file(basepath + "." + hostname + suffix);

        if (exist_file(basepath + suffix))
            return load_config_file(basepath + suffix);
    }

    // load default configuration
    load_default_config();
}